

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  Curl_easy *pCVar2;
  SSL *ssl;
  undefined8 uVar3;
  proxy_info *ppVar4;
  _Bool _Var5;
  ssl_connect_state sVar6;
  int iVar7;
  uint uVar8;
  curl_proxytype cVar9;
  CURLcode CVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  CURLcode CVar14;
  timediff_t tVar15;
  SSL_CIPHER *c;
  char *pcVar16;
  uint *puVar17;
  SSL_METHOD *meth;
  SSL_CTX *pSVar18;
  ulong uVar19;
  SSL_SESSION *ses;
  BIO_METHOD *pBVar20;
  stack_st_X509 *psVar21;
  BIO *pBVar22;
  X509 *pXVar23;
  X509_NAME *pXVar24;
  size_t sVar25;
  undefined8 uVar26;
  ASN1_INTEGER *pAVar27;
  ASN1_STRING *pAVar28;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar29;
  EVP_PKEY *pkey;
  X509 *pXVar30;
  GENERAL_NAMES *a_00;
  int *piVar31;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  ASN1_GENERALIZEDTIME *pAVar32;
  void *__src;
  size_t uznum;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar33;
  BIGNUM *pubkey;
  FILE *fp;
  OCSP_BASICRESP *bs;
  X509_STORE *st;
  OCSP_SINGLERESP *single;
  long lVar34;
  undefined7 uVar35;
  curl_socket_t writefd;
  long lVar36;
  size_t size;
  SSL_SESSION **ppSVar37;
  size_t size_00;
  long lVar38;
  char *pcVar39;
  long lVar40;
  curl_socket_t readfd0;
  Curl_easy *pCVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  BIGNUM **buffer;
  long lVar47;
  int iVar48;
  bool bVar49;
  X509 *x509;
  Curl_easy *data;
  ASN1_BIT_STRING *psig;
  X509_ALGOR *palg;
  in6_addr addr;
  EVP_PKEY *pri;
  char error_buffer [256];
  uchar protocols [128];
  Curl_easy *local_b78;
  ulong local_b70;
  ASN1_GENERALIZEDTIME *local_b68;
  Curl_easy *local_b60;
  undefined8 local_b58;
  undefined8 local_b50;
  Curl_easy *local_b48;
  BIO *local_b40;
  X509 *local_b38;
  int *local_b30;
  long local_b28;
  Curl_easy *local_b20;
  long local_b18;
  ASN1_GENERALIZEDTIME *local_b08;
  _Bool *local_b00;
  uint local_af4;
  ASN1_GENERALIZEDTIME *local_af0 [2];
  X509 *local_ae0;
  undefined8 local_ad0;
  char *local_ac0;
  ASN1_GENERALIZEDTIME *local_ab8 [16];
  BIGNUM *local_a38 [64];
  SSL_SESSION *local_838;
  char acStack_830 [2048];
  
  lVar38 = (long)sockindex;
  if (conn->ssl[lVar38].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar41 = conn->data;
  local_b60 = (Curl_easy *)CONCAT44(local_b60._4_4_,conn->sock[lVar38]);
  sVar6 = conn->ssl[lVar38].connecting_state;
  if (sVar6 == ssl_connect_1) {
    tVar15 = Curl_timeleft(pCVar41,(curltime *)0x0,true);
    if (-1 < tVar15) {
      pCVar2 = conn->data;
      local_b38 = (X509 *)CONCAT44(local_b38._4_4_,sockindex);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        local_b48 = (Curl_easy *)(conn->http_proxy).host.name;
        lVar44 = 0x6e8;
        lVar34 = 0x350;
        lVar40 = 0x358;
        lVar36 = 0x360;
        lVar43 = 0x718;
        lVar42 = 0x340;
        lVar47 = 0x6e0;
      }
      else {
        local_b48 = (Curl_easy *)(conn->host).name;
        lVar44 = 0x640;
        lVar34 = 0x308;
        lVar40 = 0x310;
        lVar36 = 0x318;
        lVar43 = 0x670;
        lVar42 = 0x2f8;
        lVar47 = 0x638;
      }
      local_b18 = CONCAT44(local_b18._4_4_,conn->sock[lVar38]);
      local_b58 = *(undefined8 *)((conn->chunk).hexbuffer + lVar40 + -0x20);
      local_b50 = *(undefined8 *)((long)pCVar2->sockets + lVar43 + -0x80);
      uVar19 = *(ulong *)((conn->chunk).hexbuffer + lVar42 + -0x20);
      uVar26 = *(undefined8 *)((conn->chunk).hexbuffer + lVar36 + -0x20);
      bVar1 = (conn->chunk).hexbuffer[lVar34 + -0x20];
      uVar3 = *(undefined8 *)((long)pCVar2->sockets + lVar44 + -0x80);
      local_b40 = (BIO *)(lVar38 * 3);
      local_b28 = lVar38;
      local_b20 = pCVar41;
      local_b00 = done;
      CVar10 = Curl_ossl_seed(pCVar2);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      local_af4 = (uint)bVar1;
      *(undefined8 *)((long)pCVar2->sockets + lVar47 + -0x80) = 1;
      local_ae0 = (X509 *)uVar3;
      local_ad0 = uVar26;
      if (7 < uVar19) {
        Curl_failf(pCVar2,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
        return CURLE_SSL_CONNECT_ERROR;
      }
      if ((0xf3UL >> (uVar19 & 0x3f) & 1) != 0) {
        meth = (SSL_METHOD *)TLS_client_method();
        pSVar18 = (SSL_CTX *)(conn->ssl[lVar38].backend)->ctx;
        if (pSVar18 != (SSL_CTX *)0x0) {
          SSL_CTX_free(pSVar18);
        }
        pSVar18 = SSL_CTX_new(meth);
        (conn->ssl[lVar38].backend)->ctx = (SSL_CTX *)pSVar18;
        if (pSVar18 != (SSL_CTX *)0x0) {
          SSL_CTX_ctrl(pSVar18,0x21,0x10,(void *)0x0);
          if (((pCVar2->set).fdebug != (curl_debug_callback)0x0) && ((pCVar2->set).verbose == true))
          {
            SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar38].backend)->ctx,ssl_tls_trace);
            SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar38].backend)->ctx,0x10,0,conn);
          }
          CVar10 = (*(code *)(&DAT_00153618 + *(int *)(&DAT_00153618 + uVar19 * 4)))();
          return CVar10;
        }
        uVar19 = ERR_peek_error();
        ERR_error_string_n(uVar19,(char *)local_a38,0x100);
        Curl_failf(pCVar2,"SSL: couldn\'t create a context: %s",local_a38);
        return CURLE_OUT_OF_MEMORY;
      }
      if (uVar19 == 2) {
        pcVar39 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar39 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar2,pcVar39);
      return CURLE_NOT_BUILT_IN;
    }
LAB_00145919:
    Curl_failf(pCVar41,"SSL connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  local_b38 = (X509 *)CONCAT44(local_b38._4_4_,sockindex);
  local_b28 = lVar38;
  local_b00 = done;
  while (lVar44 = local_b28, sVar6 - ssl_connect_2 < 3) {
    tVar15 = Curl_timeleft(pCVar41,(curltime *)0x0,true);
    if (tVar15 < 0) goto LAB_00145919;
    sVar6 = conn->ssl[lVar38].connecting_state;
    if ((sVar6 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar6 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_b60;
      }
      readfd0 = -1;
      if (sVar6 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_b60;
      }
      if (nonblocking) {
        tVar15 = 0;
      }
      iVar7 = Curl_socket_check(readfd0,-1,writefd,tVar15);
      if (iVar7 < 0) {
        puVar17 = (uint *)__errno_location();
        Curl_failf(pCVar41,"select/poll on SSL socket, errno: %d",(ulong)*puVar17);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar7 == 0) {
        if (nonblocking) {
          *local_b00 = false;
          return CURLE_OK;
        }
        goto LAB_00145919;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar44 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x638;
    }
    pCVar2 = conn->data;
    ERR_clear_error();
    iVar7 = SSL_connect((SSL *)(conn->ssl[lVar38].backend)->handle);
    if (iVar7 == 1) {
      conn->ssl[lVar38].connecting_state = ssl_connect_3;
      ssl = (SSL *)(conn->ssl[lVar38].backend)->handle;
      pcVar39 = "";
      if (ssl != (SSL *)0x0) {
        iVar7 = SSL_version(ssl);
        pcVar39 = "TLSv1.3";
        switch(iVar7) {
        case 0x300:
          pcVar39 = "SSLv3";
          break;
        case 0x301:
          pcVar39 = "TLSv1.0";
          break;
        case 0x302:
          pcVar39 = "TLSv1.1";
          break;
        case 0x303:
          pcVar39 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar7 == 2) {
            pcVar39 = "SSLv2";
          }
          else {
            pcVar39 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)(conn->ssl[lVar38].backend)->handle);
      pcVar16 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar2,"SSL connection using %s / %s\n",pcVar39,pcVar16);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected((conn->ssl[lVar38].backend)->handle,&local_838,local_a38);
        if ((int)local_a38[0] == 0) {
          Curl_infof(pCVar2,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar2,"ALPN, server accepted to use %.*s\n",(ulong)local_a38[0] & 0xffffffff,
                     local_838);
          if (((int)local_a38[0] == 8) &&
             (lVar44._0_4_ = local_838->ssl_version, lVar44._4_4_ = local_838->key_arg_length,
             lVar44 == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      uVar8 = SSL_get_error((SSL *)(conn->ssl[lVar38].backend)->handle,iVar7);
      if (uVar8 == 3) {
        conn->ssl[lVar38].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar8 != 2) {
          memset(&local_838,0,0x100);
          conn->ssl[lVar38].connecting_state = ssl_connect_2;
          uVar19 = ERR_get_error();
          uVar13 = (uint)uVar19;
          if (((-1 < (int)uVar13) && ((uVar13 & 0xff800000) == 0xa000000)) &&
             ((uVar13 & 0x7fffff) == 0x86)) {
            lVar38 = SSL_get_verify_result((SSL *)(conn->ssl[lVar38].backend)->handle);
            if (lVar38 == 0) {
              builtin_strncpy(acStack_830,"ificate verification failed",0x1c);
              local_838 = (SSL_SESSION *)0x74726563204c5353;
            }
            else {
              *(long *)((long)pCVar2->sockets + lVar44 + -0x80) = lVar38;
              pcVar39 = X509_verify_cert_error_string(lVar38);
              curl_msnprintf((char *)&local_838,0x100,"SSL certificate problem: %s",pcVar39);
            }
            CVar10 = CURLE_SSL_CACERT;
LAB_00145f36:
            Curl_failf(pCVar2,"%s",&local_838);
            return CVar10;
          }
          ERR_error_string_n(uVar19,(char *)&local_838,0x100);
          CVar10 = CURLE_SSL_CONNECT_ERROR;
          if (uVar19 != 0) goto LAB_00145f36;
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar49 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar4 = &conn->http_proxy;
            if (bVar49) {
              ppVar4 = (proxy_info *)&conn->host;
            }
            pcVar39 = (ppVar4->host).name;
            if (!bVar49) {
              lVar38 = conn->port;
              goto LAB_00147079;
            }
          }
          else {
            pcVar39 = (conn->host).name;
          }
          lVar38 = (long)conn->remote_port;
LAB_00147079:
          if (uVar8 < 0xb) {
            pcVar16 = (&PTR_anon_var_dwarf_103467_00162c60)[uVar8];
          }
          else {
            pcVar16 = "SSL_ERROR unknown";
          }
          Curl_failf(pCVar2,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar16,pcVar39,
                     lVar38);
          return CURLE_SSL_CONNECT_ERROR;
        }
        conn->ssl[lVar38].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar6 = conn->ssl[lVar38].connecting_state;
    if ((nonblocking) && (sVar6 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar6 == ssl_connect_3) {
    pCVar41 = conn->data;
    cVar9 = (conn->http_proxy).proxytype;
    if ((cVar9 == CURLPROXY_HTTPS) &&
       (iVar7 = conn->sock[1], conn->proxy_ssl[iVar7 != -1].state != ssl_connection_complete)) {
      if ((pCVar41->set).proxy_ssl.primary.sessionid != false) {
LAB_00145d4a:
        local_838 = (SSL_SESSION *)0x0;
        ses = SSL_get1_session((SSL *)(conn->ssl[lVar38].backend)->handle);
        Curl_ssl_sessionid_lock(conn);
        _Var5 = Curl_ssl_getsessionid(conn,&local_838,(size_t *)0x0,(int)local_b38);
        if ((_Var5) || (local_838 == ses)) {
          if (_Var5) goto LAB_00145dbc;
          SSL_SESSION_free(ses);
        }
        else {
          Curl_infof(pCVar41,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid(conn,local_838);
LAB_00145dbc:
          CVar10 = Curl_ssl_addsessionid(conn,ses,0,(int)local_b38);
          if (CVar10 != CURLE_OK) {
            Curl_ssl_sessionid_unlock(conn);
            Curl_failf(pCVar41,"failed to store ssl session");
            return CVar10;
          }
        }
        Curl_ssl_sessionid_unlock(conn);
        cVar9 = (conn->http_proxy).proxytype;
        goto LAB_00145f6b;
      }
LAB_00145f77:
      if (conn->proxy_ssl[iVar7 != -1].state == ssl_connection_complete) goto LAB_00145f8f;
      if ((conn->proxy_ssl_config).verifypeer == true) {
        pCVar41 = conn->data;
        local_b18 = 0x6e0;
        goto LAB_00145fcd;
      }
      local_b58 = CONCAT71(local_b58._1_7_,(conn->proxy_ssl_config).verifyhost);
      pCVar41 = conn->data;
      local_b18 = 0x6e0;
    }
    else {
      if ((pCVar41->set).ssl.primary.sessionid == true) goto LAB_00145d4a;
LAB_00145f6b:
      if (cVar9 == CURLPROXY_HTTPS) {
        iVar7 = conn->sock[1];
        goto LAB_00145f77;
      }
LAB_00145f8f:
      if ((conn->ssl_config).verifypeer == true) {
        pCVar41 = conn->data;
        local_b18 = 0x638;
LAB_00145fcd:
        local_b58 = CONCAT71(local_b58._1_7_,1);
      }
      else {
        local_b58 = CONCAT71(local_b58._1_7_,(conn->ssl_config).verifyhost);
        pCVar41 = conn->data;
        local_b18 = 0x638;
      }
    }
    pBVar20 = BIO_s_mem();
    local_b20 = (Curl_easy *)BIO_new(pBVar20);
    if ((pCVar41->set).ssl.certinfo == true) {
      local_b60 = conn->data;
      psVar21 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar38].backend)->handle);
      if (psVar21 != (stack_st_X509 *)0x0) {
        iVar7 = OPENSSL_sk_num(psVar21);
        CVar10 = Curl_ssl_init_certinfo(local_b60,iVar7);
        if (CVar10 == CURLE_OK) {
          local_b48 = pCVar41;
          pBVar20 = BIO_s_mem();
          pBVar22 = BIO_new(pBVar20);
          if (0 < iVar7) {
            iVar48 = 0;
            local_b50 = CONCAT44(local_b50._4_4_,iVar7);
            local_b40 = pBVar22;
            do {
              pXVar23 = (X509 *)OPENSSL_sk_value(psVar21,iVar48);
              local_b30 = (int *)0x0;
              pXVar24 = X509_get_subject_name(pXVar23);
              X509_NAME_print_ex(pBVar22,pXVar24,0,0x82031f);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              pCVar41 = local_b60;
              Curl_ssl_push_certinfo_len(local_b60,iVar48,"Subject",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              pXVar24 = X509_get_issuer_name(pXVar23);
              X509_NAME_print_ex(pBVar22,pXVar24,0,0x82031f);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              Curl_ssl_push_certinfo_len(pCVar41,iVar48,"Issuer",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              uVar26 = X509_get_version(pXVar23);
              BIO_printf(pBVar22,"%lx",uVar26);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              Curl_ssl_push_certinfo_len(pCVar41,iVar48,"Version",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              local_b38 = pXVar23;
              pAVar27 = X509_get_serialNumber(pXVar23);
              if (pAVar27->type == 0x102) {
                BIO_puts(pBVar22,"-");
              }
              if (0 < pAVar27->length) {
                lVar44 = 0;
                do {
                  BIO_printf(pBVar22,"%02x",(ulong)pAVar27->data[lVar44]);
                  lVar44 = lVar44 + 1;
                } while (lVar44 < pAVar27->length);
              }
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              pCVar41 = local_b60;
              Curl_ssl_push_certinfo_len(local_b60,iVar48,"Serial Number",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              local_b08 = (ASN1_GENERALIZEDTIME *)0x0;
              pAVar28 = ASN1_STRING_new();
              if (pAVar28 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_b30,&local_b08,local_b38);
                X509_signature_print(pBVar22,(X509_ALGOR *)local_b08,pAVar28);
                ASN1_STRING_free(pAVar28);
                if (local_b08 != (ASN1_GENERALIZEDTIME *)0x0) {
                  i2a_ASN1_OBJECT(pBVar22,*(ASN1_OBJECT **)local_b08);
                  sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
                  Curl_ssl_push_certinfo_len
                            (pCVar41,iVar48,"Public Key Algorithm",(char *)local_b68,sVar25);
                  BIO_ctrl(pBVar22,1,0,(void *)0x0);
                }
              }
              uVar26 = X509_get0_extensions(local_b38);
              iVar7 = OPENSSL_sk_num(uVar26);
              if ((0 < iVar7) && (iVar7 = OPENSSL_sk_num(uVar26), 0 < iVar7)) {
                iVar7 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar26,iVar7);
                  pBVar20 = BIO_s_mem();
                  pBVar22 = BIO_new(pBVar20);
                  if (pBVar22 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_ab8,0x80,a);
                  iVar11 = X509V3_EXT_print(pBVar22,ex,0,0);
                  if (iVar11 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(pBVar22,v);
                  }
                  BIO_ctrl(pBVar22,0x73,0,local_af0);
                  uVar19._0_4_ = local_af0[0]->length;
                  uVar19._4_4_ = local_af0[0]->type;
                  if (uVar19 != 0) {
                    buffer = local_a38;
                    uVar45 = 0;
                    pAVar32 = local_af0[0];
                    do {
                      bVar49 = pAVar32->data[uVar45] == '\n';
                      pcVar39 = "";
                      if (bVar49) {
                        pcVar39 = ", ";
                      }
                      uVar45 = bVar49 + uVar45;
                      uVar46 = uVar45;
                      for (; uVar45 < uVar19; uVar45 = uVar45 + 1) {
                        if (pAVar32->data[uVar45] != ' ') {
                          iVar11 = curl_msnprintf((char *)buffer,(long)&local_838 - (long)buffer,
                                                  "%s%c",pcVar39);
                          buffer = (BIGNUM **)((long)buffer + (long)iVar11);
                          uVar19._0_4_ = local_af0[0]->length;
                          uVar19._4_4_ = local_af0[0]->type;
                          pAVar32 = local_af0[0];
                          uVar46 = uVar45;
                          break;
                        }
                        uVar46 = uVar19;
                      }
                      uVar45 = uVar46 + 1;
                    } while (uVar45 < uVar19);
                  }
                  pCVar41 = local_b60;
                  Curl_ssl_push_certinfo(local_b60,iVar48,(char *)local_ab8,(char *)local_a38);
                  BIO_free(pBVar22);
                  iVar7 = iVar7 + 1;
                  iVar11 = OPENSSL_sk_num(uVar26);
                } while (iVar7 < iVar11);
              }
              pXVar23 = local_b38;
              pAVar29 = (ASN1_TIME *)X509_get0_notBefore(local_b38);
              pBVar22 = local_b40;
              ASN1_TIME_print(local_b40,pAVar29);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              Curl_ssl_push_certinfo_len(pCVar41,iVar48,"Start date",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              pAVar29 = (ASN1_TIME *)X509_get0_notAfter(pXVar23);
              ASN1_TIME_print(pBVar22,pAVar29);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              Curl_ssl_push_certinfo_len(pCVar41,iVar48,"Expire date",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              pkey = X509_get_pubkey(pXVar23);
              if (pkey == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar41,"   Unable to load public key\n");
              }
              else {
                iVar7 = EVP_PKEY_get_id(pkey);
                if (iVar7 == 0x74) {
                  uVar26 = EVP_PKEY_get0_DSA(pkey);
                  DSA_get0_pqg(uVar26,local_a38,local_ab8,local_af0);
                  DSA_get0_key(uVar26,&local_b08,0);
                  pCVar41 = local_b60;
                  pubkey_show(local_b60,(BIO *)local_b40,iVar48,"dsa","p",(BIGNUM *)local_a38[0]);
                  pBVar22 = local_b40;
                  pubkey_show(pCVar41,(BIO *)local_b40,iVar48,"dsa","q",(BIGNUM *)local_ab8[0]);
                  pubkey_show(local_b60,(BIO *)pBVar22,iVar48,"dsa","g",(BIGNUM *)local_af0[0]);
                  pcVar39 = "dsa";
LAB_00146815:
                  pcVar16 = "pub_key";
                  pCVar41 = local_b60;
                  pAVar32 = local_b08;
LAB_0014681c:
                  pubkey_show(pCVar41,(BIO *)pBVar22,iVar48,pcVar39,pcVar16,(BIGNUM *)pAVar32);
                }
                else {
                  if (iVar7 == 0x1c) {
                    uVar26 = EVP_PKEY_get0_DH(pkey);
                    DH_get0_pqg(uVar26,local_a38,local_ab8,local_af0);
                    DH_get0_key(uVar26,&local_b08,0);
                    pCVar41 = local_b60;
                    pubkey_show(local_b60,(BIO *)local_b40,iVar48,"dh","p",(BIGNUM *)local_a38[0]);
                    pBVar22 = local_b40;
                    pubkey_show(pCVar41,(BIO *)local_b40,iVar48,"dh","q",(BIGNUM *)local_ab8[0]);
                    pubkey_show(local_b60,(BIO *)pBVar22,iVar48,"dh","g",(BIGNUM *)local_af0[0]);
                    pcVar39 = "dh";
                    goto LAB_00146815;
                  }
                  if (iVar7 == 6) {
                    uVar26 = EVP_PKEY_get0_RSA(pkey);
                    RSA_get0_key(uVar26,local_a38,local_ab8,0);
                    pBVar22 = local_b40;
                    BN_print(local_b40,local_a38[0]);
                    sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
                    pCVar41 = local_b60;
                    Curl_ssl_push_certinfo_len
                              (local_b60,iVar48,"RSA Public Key",(char *)local_b68,sVar25);
                    BIO_ctrl(pBVar22,1,0,(void *)0x0);
                    pubkey_show(pCVar41,(BIO *)pBVar22,iVar48,"rsa","n",(BIGNUM *)local_a38[0]);
                    pcVar39 = "rsa";
                    pcVar16 = "e";
                    pAVar32 = local_ab8[0];
                    goto LAB_0014681c;
                  }
                }
                EVP_PKEY_free(pkey);
                pCVar41 = local_b60;
              }
              pBVar22 = local_b40;
              if (local_b30 != (int *)0x0) {
                if (0 < *local_b30) {
                  lVar44 = 0;
                  do {
                    BIO_printf(pBVar22,"%02x:",(ulong)*(byte *)(*(long *)(local_b30 + 2) + lVar44));
                    lVar44 = lVar44 + 1;
                  } while (lVar44 < *local_b30);
                }
                sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
                pCVar41 = local_b60;
                Curl_ssl_push_certinfo_len(local_b60,iVar48,"Signature",(char *)local_b68,sVar25);
                BIO_ctrl(pBVar22,1,0,(void *)0x0);
              }
              pBVar22 = local_b40;
              PEM_write_bio_X509(local_b40,local_b38);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_b68);
              Curl_ssl_push_certinfo_len(pCVar41,iVar48,"Cert",(char *)local_b68,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              iVar48 = iVar48 + 1;
            } while (iVar48 != (int)local_b50);
          }
          BIO_free(pBVar22);
          lVar44 = local_b28;
          pCVar41 = local_b48;
        }
      }
    }
    pXVar30 = (X509 *)SSL_get1_peer_certificate((conn->ssl[lVar38].backend)->handle);
    (conn->ssl[lVar38].backend)->server_cert = pXVar30;
    if (pXVar30 == (X509 *)0x0) {
      BIO_free((BIO *)local_b20);
      if ((char)local_b58 != '\0') {
        Curl_failf(pCVar41,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar39 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar39 = "Server";
        }
      }
      else {
        pcVar39 = "Server";
      }
      Curl_infof(pCVar41,"%s certificate:\n",pcVar39);
      pXVar24 = X509_get_subject_name((X509 *)(conn->ssl[lVar38].backend)->server_cert);
      iVar7 = x509_name_oneline((X509_NAME *)pXVar24,(char *)&local_838,size);
      ppSVar37 = (SSL_SESSION **)"[NONE]";
      if (iVar7 == 0) {
        ppSVar37 = &local_838;
      }
      Curl_infof(pCVar41," subject: %s\n",ppSVar37);
      pAVar29 = (ASN1_TIME *)X509_get0_notBefore((conn->ssl[lVar38].backend)->server_cert);
      pCVar2 = local_b20;
      ASN1_TIME_print((BIO *)local_b20,pAVar29);
      lVar44 = BIO_ctrl((BIO *)pCVar2,3,0,&local_ac0);
      Curl_infof(pCVar41," start date: %.*s\n",lVar44);
      BIO_ctrl((BIO *)pCVar2,1,0,(void *)0x0);
      pAVar29 = (ASN1_TIME *)X509_get0_notAfter((conn->ssl[lVar38].backend)->server_cert);
      ASN1_TIME_print((BIO *)pCVar2,pAVar29);
      lVar44 = BIO_ctrl((BIO *)pCVar2,3,0,&local_ac0);
      Curl_infof(pCVar41," expire date: %.*s\n",lVar44);
      BIO_ctrl((BIO *)pCVar2,1,0,(void *)0x0);
      BIO_free((BIO *)pCVar2);
      local_b48 = pCVar41;
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == true) {
          pXVar23 = (X509 *)(conn->ssl[lVar38].backend)->server_cert;
          local_b78 = conn->data;
          lVar44 = 0x168;
          lVar34 = 0x160;
LAB_00146b47:
          pBVar22 = *(BIO **)((conn->chunk).hexbuffer + lVar34 + -0x20);
          local_b50 = *(undefined8 *)((conn->chunk).hexbuffer + lVar44 + -0x20);
          local_b40 = pBVar22;
          if (((conn->bits).ipv6_ip == true) &&
             (iVar7 = inet_pton(10,(char *)pBVar22,local_a38), iVar7 != 0)) {
            iVar7 = 7;
            local_b38 = (X509 *)0x10;
          }
          else {
            iVar7 = inet_pton(2,(char *)pBVar22,local_a38);
            local_b38 = (X509 *)(ulong)((uint)(iVar7 != 0) * 4);
            iVar7 = (uint)(iVar7 != 0) * 5 + 2;
          }
          uVar19 = 0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar23,0x55,(int *)0x0,(int *)0x0);
          if (a_00 != (GENERAL_NAMES *)0x0) {
            iVar48 = OPENSSL_sk_num(a_00);
            if (0 < iVar48) {
              local_b70 = 0;
              local_b60 = (Curl_easy *)((ulong)local_b60 & 0xffffffff00000000);
              uVar26 = 0;
              iVar11 = 0;
              local_ae0 = pXVar23;
LAB_00146c0a:
              local_b20 = (Curl_easy *)CONCAT44(local_b20._4_4_,(int)uVar26);
              do {
                piVar31 = (int *)OPENSSL_sk_value(a_00,iVar11);
                iVar12 = *piVar31;
                uVar35 = (undefined7)(uVar19 >> 8);
                if (iVar12 == 2) {
                  uVar19 = CONCAT71(uVar35,1);
                  local_b70 = uVar19 & 0xffffffff;
                }
                else if (iVar12 == 7) {
                  uVar19 = CONCAT71(uVar35,1);
                  local_b60 = (Curl_easy *)CONCAT44(local_b60._4_4_,(int)uVar19);
                }
                if (iVar12 == iVar7) {
                  pcVar39 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar31 + 2));
                  iVar12 = ASN1_STRING_length(*(ASN1_STRING **)(piVar31 + 2));
                  if (iVar7 == 7) {
                    if ((local_b38 == (X509 *)(long)iVar12) &&
                       (iVar12 = bcmp(pcVar39,local_a38,(size_t)local_b38), iVar12 == 0))
                    goto LAB_00146cb5;
                  }
                  else if (((iVar7 == 2) &&
                           (pXVar23 = (X509 *)strlen(pcVar39), pXVar23 == (X509 *)(long)iVar12)) &&
                          (iVar12 = Curl_cert_hostcheck(pcVar39,(char *)local_b40), iVar12 != 0)) {
                    Curl_infof(local_b78," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                               local_b50);
                    goto LAB_00147c73;
                  }
                }
                iVar11 = iVar11 + 1;
                if (iVar48 <= iVar11) {
                  GENERAL_NAMES_free(a_00);
                  uVar26 = local_b50;
                  pCVar41 = local_b48;
                  if (((ulong)local_b20 & 1) != 0) goto LAB_00147476;
                  pXVar23 = local_ae0;
                  if ((char)local_b70 == '\0' && ((ulong)local_b60 & 1) == 0) goto LAB_00147109;
                  Curl_infof(local_b78," subjectAltName does not match %s\n",local_b50);
                  Curl_failf(local_b78,
                             "SSL: no alternative certificate subject name matches target host name \'%s\'"
                             ,uVar26);
                  goto LAB_001470fe;
                }
              } while( true );
            }
            GENERAL_NAMES_free(a_00);
          }
LAB_00147109:
          local_ab8[0] = (ASN1_GENERALIZEDTIME *)0x15360c;
          pXVar24 = X509_get_subject_name(pXVar23);
          if (pXVar24 == (X509_NAME *)0x0) {
LAB_001473bc:
            if (local_ab8[0] == (ASN1_GENERALIZEDTIME *)0x15360c) {
              local_ab8[0] = (ASN1_GENERALIZEDTIME *)0x0;
              goto LAB_00147413;
            }
            if (local_ab8[0] == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_00147413;
            iVar7 = Curl_cert_hostcheck((char *)local_ab8[0],(char *)local_b40);
            if (iVar7 == 0) {
              Curl_failf(local_b78,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,local_ab8[0]);
              goto LAB_00147426;
            }
            CVar10 = CURLE_OK;
            Curl_infof(local_b78," common name: %s (matched)\n");
          }
          else {
            iVar7 = -1;
            do {
              iVar48 = iVar7;
              iVar7 = X509_NAME_get_index_by_NID(pXVar24,0xd,iVar48);
            } while (-1 < iVar7);
            if (iVar48 < 0) goto LAB_001473bc;
            ne = X509_NAME_get_entry(pXVar24,iVar48);
            pAVar28 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar28 == (ASN1_STRING *)0x0) goto LAB_001473bc;
            iVar7 = ASN1_STRING_type(pAVar28);
            if (iVar7 == 0xc) {
              uVar8 = ASN1_STRING_length(pAVar28);
              if ((int)uVar8 < 0) {
                pAVar32 = (ASN1_GENERALIZEDTIME *)0x15360c;
              }
              else {
                pAVar32 = (ASN1_GENERALIZEDTIME *)
                          CRYPTO_malloc(uVar8 + 1,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/lib/vtls/openssl.c"
                                        ,0x5c9);
                local_ab8[0] = pAVar32;
                if (pAVar32 == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_00147413;
                __src = (void *)ASN1_STRING_get0_data(pAVar28);
                memcpy(pAVar32,__src,(ulong)uVar8);
                *(char *)((long)&pAVar32->length + (ulong)uVar8) = '\0';
              }
LAB_001473a3:
              uznum = strlen((char *)pAVar32);
              uVar13 = curlx_uztosi(uznum);
              if (uVar13 == uVar8) goto LAB_001473bc;
              Curl_failf(local_b78,"SSL: illegal cert name field");
              CVar10 = CURLE_PEER_FAILED_VERIFICATION;
              if (local_ab8[0] == (ASN1_GENERALIZEDTIME *)0x15360c) {
LAB_001470fe:
                CVar10 = CURLE_PEER_FAILED_VERIFICATION;
                goto LAB_00147458;
              }
              goto LAB_0014743d;
            }
            uVar8 = ASN1_STRING_to_UTF8((uchar **)local_ab8,pAVar28);
            pAVar32 = local_ab8[0];
            if (local_ab8[0] != (ASN1_GENERALIZEDTIME *)0x0) goto LAB_001473a3;
LAB_00147413:
            Curl_failf(local_b78,"SSL: unable to obtain common name from peer certificate");
LAB_00147426:
            CVar10 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_0014743d:
          pCVar41 = local_b48;
          if (local_ab8[0] != (ASN1_GENERALIZEDTIME *)0x0) {
            CRYPTO_free(local_ab8[0]);
          }
          if (CVar10 != CURLE_OK) {
LAB_00147458:
            X509_free((X509 *)(conn->ssl[lVar38].backend)->server_cert);
            (conn->ssl[lVar38].backend)->server_cert = (X509 *)0x0;
            return CVar10;
          }
        }
      }
      else if ((conn->ssl_config).verifyhost != false) {
        pXVar23 = (X509 *)(conn->ssl[lVar38].backend)->server_cert;
        local_b78 = conn->data;
        lVar44 = 0xe0;
        lVar34 = 0xd8;
        goto LAB_00146b47;
      }
LAB_00147476:
      pXVar24 = X509_get_issuer_name((X509 *)(conn->ssl[lVar38].backend)->server_cert);
      iVar7 = x509_name_oneline((X509_NAME *)pXVar24,(char *)&local_838,size_00);
      if (iVar7 == 0) {
        Curl_infof(pCVar41," issuer: %s\n",&local_838);
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar39 = (pCVar41->set).proxy_ssl.issuercert;
        }
        else {
          pcVar39 = (pCVar41->set).ssl.issuercert;
        }
        if (pcVar39 != (char *)0x0) {
          fp = fopen64(pcVar39,"r");
          if (fp == (FILE *)0x0) {
            if ((char)local_b58 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar44 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar44 = 0x648;
              }
              Curl_failf(pCVar41,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)pCVar41->sockets + lVar44 + -0x80));
            }
            pXVar23 = (X509 *)(conn->ssl[lVar38].backend)->server_cert;
LAB_00147895:
            X509_free(pXVar23);
            (conn->ssl[lVar38].backend)->server_cert = (X509 *)0x0;
            return CURLE_SSL_ISSUER_ERROR;
          }
          pXVar23 = PEM_read_X509(fp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar23 == (X509 *)0x0) {
            if ((char)local_b58 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar44 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar44 = 0x648;
              }
              Curl_failf(pCVar41,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)pCVar41->sockets + lVar44 + -0x80));
            }
            X509_free((X509 *)(conn->ssl[lVar38].backend)->server_cert);
            X509_free((X509 *)0x0);
            fclose(fp);
            return CURLE_SSL_ISSUER_ERROR;
          }
          fclose(fp);
          iVar7 = X509_check_issued(pXVar23,(X509 *)(conn->ssl[lVar38].backend)->server_cert);
          if (iVar7 != 0) {
            if ((char)local_b58 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar44 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar44 = 0x648;
              }
              Curl_failf(pCVar41,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)pCVar41->sockets + lVar44 + -0x80));
            }
            X509_free((X509 *)(conn->ssl[lVar38].backend)->server_cert);
            goto LAB_00147895;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar44 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar44 = 0x648;
          }
          Curl_infof(pCVar41," SSL certificate issuer check ok (%s)\n",
                     *(undefined8 *)((long)pCVar41->sockets + lVar44 + -0x80));
          X509_free(pXVar23);
        }
        lVar44 = SSL_get_verify_result((SSL *)(conn->ssl[lVar38].backend)->handle);
        *(long *)((long)pCVar41->sockets + local_b18 + -0x80) = lVar44;
        if (lVar44 == 0) {
          CVar10 = CURLE_OK;
          Curl_infof(pCVar41," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_00147b92:
              pcVar39 = X509_verify_cert_error_string(lVar44);
              CVar10 = CURLE_OK;
              Curl_infof(pCVar41," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar39,lVar44);
              goto LAB_001474b8;
            }
          }
          else if ((conn->ssl_config).verifypeer != true) goto LAB_00147b92;
          CVar10 = CURLE_PEER_FAILED_VERIFICATION;
          if ((char)local_b58 != '\0') {
            pcVar39 = X509_verify_cert_error_string(lVar44);
            Curl_failf(pCVar41,"SSL certificate verify result: %s (%ld)",pcVar39,lVar44);
          }
        }
      }
      else {
        CVar10 = CURLE_SSL_CONNECT_ERROR;
        if ((char)local_b58 != '\0') {
          Curl_failf(pCVar41,"SSL: couldn\'t get X509-issuer name!");
        }
      }
LAB_001474b8:
      cVar9 = (conn->http_proxy).proxytype;
      if ((cVar9 == CURLPROXY_HTTPS) &&
         (iVar7 = conn->sock[1], conn->proxy_ssl[iVar7 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifystatus == false) {
          CVar14 = CURLE_OK;
          if ((char)local_b58 != '\0') {
            CVar14 = CVar10;
          }
          goto LAB_00147630;
        }
LAB_0014757a:
        pCVar41 = conn->data;
        lVar44 = SSL_ctrl((SSL *)(conn->ssl[lVar38].backend)->handle,0x46,0,local_a38);
        if (local_a38[0] == (BIGNUM *)0x0) {
          resp = (OCSP_RESPONSE *)0x0;
          Curl_failf(pCVar41,"No OCSP response received");
          lVar44 = local_b28;
LAB_00147814:
          OCSP_RESPONSE_free(resp);
          CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)local_a38,lVar44);
          lVar44 = local_b28;
          if (resp == (OCSP_RESPONSE *)0x0) {
            resp = (OCSP_RESPONSE *)0x0;
            Curl_failf(pCVar41,"Invalid OCSP response");
            goto LAB_00147814;
          }
          uVar8 = OCSP_response_status(resp);
          if (uVar8 != 0) {
            pcVar39 = OCSP_response_status_str((long)(int)uVar8);
            Curl_failf(pCVar41,"Invalid OCSP response status: %s (%d)",pcVar39,(ulong)uVar8);
            goto LAB_00147814;
          }
          bs = OCSP_response_get1_basic(resp);
          if (bs == (OCSP_BASICRESP *)0x0) {
            Curl_failf(pCVar41,"Invalid OCSP response");
            goto LAB_00147814;
          }
          psVar21 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar38].backend)->handle);
          st = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar38].backend)->ctx);
          CVar14 = CURLE_OK;
          iVar7 = OCSP_basic_verify(bs,psVar21,st,0);
          if (iVar7 < 1) {
            bVar49 = false;
            Curl_failf(pCVar41,"OCSP response verification failed");
            CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            iVar7 = OCSP_resp_count(bs);
            bVar49 = true;
            if (0 < iVar7) {
              iVar7 = 0;
              do {
                single = OCSP_resp_get0(bs,iVar7);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar8 = OCSP_single_get0_status
                                    (single,(int *)&local_b30,local_ab8,local_af0,&local_b68);
                  iVar48 = OCSP_check_validity(local_af0[0],local_b68,300,-1);
                  if (iVar48 == 0) {
                    Curl_failf(pCVar41,"OCSP response has expired");
                  }
                  else {
                    pcVar39 = OCSP_cert_status_str((long)(int)uVar8);
                    Curl_infof(pCVar41,"SSL certificate status: %s (%d)\n",pcVar39,(ulong)uVar8);
                    if (uVar8 != 2) {
                      if (uVar8 != 1) goto LAB_001479d6;
                      pcVar39 = OCSP_crl_reason_str((long)(int)local_b30);
                      Curl_failf(pCVar41,"SSL certificate revocation reason: %s (%d)",pcVar39,
                                 (ulong)local_b30 & 0xffffffff);
                    }
                  }
                  CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
                  bVar49 = false;
                  goto LAB_00148562;
                }
LAB_001479d6:
                iVar7 = iVar7 + 1;
                iVar48 = OCSP_resp_count(bs);
              } while (iVar7 < iVar48);
              CVar14 = CURLE_OK;
            }
          }
LAB_00148562:
          OCSP_BASICRESP_free(bs);
          OCSP_RESPONSE_free(resp);
          lVar44 = local_b28;
          if (bVar49) {
            cVar9 = (conn->http_proxy).proxytype;
            CVar10 = CURLE_OK;
            pCVar41 = local_b48;
            goto LAB_001474f5;
          }
        }
        X509_free((X509 *)(conn->ssl[lVar38].backend)->server_cert);
        (conn->ssl[lVar38].backend)->server_cert = (X509 *)0x0;
      }
      else {
        if ((conn->ssl_config).verifystatus == true) goto LAB_0014757a;
LAB_001474f5:
        CVar14 = CURLE_OK;
        if ((char)local_b58 != '\0') {
          CVar14 = CVar10;
        }
        lVar34 = 0x8e0;
        if (cVar9 == CURLPROXY_HTTPS) {
          iVar7 = conn->sock[1];
LAB_00147630:
          lVar34 = (ulong)(conn->proxy_ssl[iVar7 != -1].state != ssl_connection_complete) * 8 +
                   0x8e0;
        }
        lVar44 = local_b28;
        pcVar39 = *(char **)((long)pCVar41->sockets + lVar34 + -0x80);
        local_ac0 = pcVar39;
        if ((CVar14 == CURLE_OK) && (pcVar39 != (char *)0x0)) {
          pXVar30 = (conn->ssl[lVar38].backend)->server_cert;
          if (pXVar30 == (X509 *)0x0) {
LAB_00147bc4:
            CVar14 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar33 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
            uVar8 = i2d_X509_PUBKEY(pXVar33,(uchar **)0x0);
            if ((int)uVar8 < 1) goto LAB_00147bc4;
            uVar19 = (ulong)uVar8;
            pubkey = (BIGNUM *)(*Curl_cmalloc)(uVar19);
            local_a38[0] = pubkey;
            if (pubkey == (BIGNUM *)0x0) goto LAB_00147bc4;
            pXVar33 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
            uVar13 = i2d_X509_PUBKEY(pXVar33,(uchar **)local_a38);
            if (((long)local_a38[0] - (long)pubkey != uVar19 || uVar8 != uVar13) ||
                local_a38[0] == (BIGNUM *)0x0) {
              (*Curl_cfree)(pubkey);
              goto LAB_00147bc4;
            }
            CVar14 = Curl_pin_peer_pubkey(local_b48,pcVar39,(uchar *)pubkey,uVar19);
            (*Curl_cfree)(pubkey);
            if (CVar14 == CURLE_OK) {
              CVar14 = CURLE_OK;
              goto LAB_00147be6;
            }
          }
          Curl_failf(local_b48,"SSL: public key does not match pinned public key!");
        }
LAB_00147be6:
        X509_free((X509 *)(conn->ssl[lVar38].backend)->server_cert);
        (conn->ssl[lVar38].backend)->server_cert = (X509 *)0x0;
        conn->ssl[lVar38].connecting_state = ssl_connect_done;
      }
      if (CVar14 != CURLE_OK) {
        return CVar14;
      }
    }
  }
  else if (sVar6 != ssl_connect_done) {
    _Var5 = false;
    goto LAB_00145bb1;
  }
  conn->ssl[lVar38].state = ssl_connection_complete;
  conn->recv[lVar44] = ossl_recv;
  conn->send[lVar44] = ossl_send;
  _Var5 = true;
LAB_00145bb1:
  *local_b00 = _Var5;
  conn->ssl[lVar38].connecting_state = ssl_connect_1;
  return CURLE_OK;
LAB_00146cb5:
  Curl_infof(local_b78," subjectAltName: host \"%s\" matched cert\'s IP address!\n",local_b50);
  iVar11 = iVar11 + 1;
  uVar26 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if (iVar48 <= iVar11) goto LAB_00147c73;
  goto LAB_00146c0a;
LAB_00147c73:
  GENERAL_NAMES_free(a_00);
  pCVar41 = local_b48;
  goto LAB_00147476;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}